

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O1

void __thiscall f8n::prefs::Preferences::Load(Preferences *this)

{
  long *plVar1;
  FILE *__stream;
  ulong __size;
  void *__ptr;
  long *plVar2;
  bool in_DL;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  _Any_data local_b8;
  code *local_a8;
  undefined8 uStack_a0;
  string local_90;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  char *local_50;
  undefined8 local_48;
  undefined2 local_40;
  undefined1 uStack_3e;
  undefined5 uStack_3d;
  
  env::GetDataDirectory_abi_cxx11_(&local_90,(env *)0x1,in_DL);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_138 = &local_128;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_128 = *plVar2;
    lStack_120 = plVar1[3];
  }
  else {
    local_128 = *plVar2;
    local_138 = (long *)*plVar1;
  }
  local_130 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_138,(ulong)(this->component)._M_dataplus._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_e8 = *plVar2;
    lStack_e0 = plVar1[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar2;
    local_f8 = (long *)*plVar1;
  }
  local_f0 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_108 = *plVar2;
    lStack_100 = plVar1[3];
    local_118 = &local_108;
  }
  else {
    local_108 = *plVar2;
    local_118 = (long *)*plVar1;
  }
  local_110 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  if (local_110 != 0) {
    local_40 = 0x6272;
    local_48 = 2;
    uStack_3e = 0;
    local_50 = (char *)&local_40;
    __stream = fopen((char *)local_118,(char *)&local_40);
    if (local_50 != (char *)&local_40) {
      operator_delete(local_50,CONCAT53(uStack_3d,CONCAT12(uStack_3e,local_40)) + 1);
    }
    if (__stream != (FILE *)0x0) {
      fseek(__stream,0,2);
      __size = ftell(__stream);
      rewind(__stream);
      if (0 < (long)__size) {
        __ptr = operator_new__(__size);
        fread(__ptr,__size,1,__stream);
        std::__cxx11::string::_M_replace
                  ((ulong)&local_158,0,(char *)local_158._M_string_length,(ulong)__ptr);
        operator_delete__(__ptr);
      }
      fclose(__stream);
    }
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,local_128 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_158._M_string_length != (char *)0x0) {
    local_a8 = (code *)0x0;
    uStack_a0 = 0;
    local_b8._M_unused._M_object = (void *)0x0;
    local_b8._8_8_ = 0;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::parse<std::__cxx11::string&>
              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_60,&local_158,(parser_callback_t *)&local_b8,true,false);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator=(&this->json,&local_60);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_60);
    if (local_a8 != (code *)0x0) {
      (*local_a8)(&local_b8,&local_b8,__destroy_functor);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Preferences::Load() {
    std::string str = fileToString(FILENAME(this->component));
    if (str.size()) {
        try {
            this->json = json::parse(str);
        }
        catch (...) {
            std::cerr << "error loading " << this->component << ".json";
            this->json = json::parse("{ }");
        }
    }
}